

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O2

AST * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::builtinTrace
          (Interpreter *this,LocationRange *loc,
          vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
          *args)

{
  pointer pVVar1;
  anon_union_8_3_4e909c26_for_v aVar2;
  undefined4 uVar3;
  ostream *poVar4;
  RuntimeError *__return_storage_ptr__;
  Type t;
  string local_1d0;
  string str;
  
  pVVar1 = (args->
           super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (pVVar1->t == STRING) {
    encode_utf8(&str,(UString *)((pVVar1->v).h + 1));
    poVar4 = std::operator<<((ostream *)&std::cerr,"TRACE: ");
    poVar4 = std::operator<<(poVar4,(string *)loc);
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4," ");
    poVar4 = std::operator<<(poVar4,(string *)&str);
    std::endl<char,std::char_traits<char>>(poVar4);
    pVVar1 = (args->
             super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar3 = *(undefined4 *)&pVVar1[1].field_0x4;
    aVar2 = pVVar1[1].v;
    (this->scratch).t = pVVar1[1].t;
    *(undefined4 *)&(this->scratch).field_0x4 = uVar3;
    (this->scratch).v = aVar2;
    std::__cxx11::string::~string((string *)&str);
    return (AST *)0x0;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&str);
  poVar4 = std::operator<<((ostream *)str.field_2._M_local_buf,
                           "Builtin function trace expected string as first parameter but ");
  poVar4 = std::operator<<(poVar4,"got ");
  (anonymous_namespace)::type_str_abi_cxx11_
            (&local_1d0,
             (_anonymous_namespace_ *)
             (ulong)((args->
                     super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
                     )._M_impl.super__Vector_impl_data._M_start)->t,t);
  std::operator<<(poVar4,(string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  __return_storage_ptr__ = (RuntimeError *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  Stack::makeError(__return_storage_ptr__,&this->stack,loc,&local_1d0);
  __cxa_throw(__return_storage_ptr__,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
}

Assistant:

const AST *builtinTrace(const LocationRange &loc, const std::vector<Value> &args)
    {
        if(args[0].t != Value::STRING) {
            std::stringstream ss;
            ss << "Builtin function trace expected string as first parameter but "
               << "got " << type_str(args[0].t);
            throw makeError(loc, ss.str());
        }

        std::string str = encode_utf8(static_cast<HeapString *>(args[0].v.h)->value);
        std::cerr << "TRACE: " << loc.file << ":" << loc.begin.line << " " <<  str
            << std::endl;

        scratch = args[1];
        return nullptr;
    }